

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_fill_rect_multi_color
               (nk_draw_list *list,nk_rect rect,nk_color left,nk_color top,nk_color right,
               nk_color bottom)

{
  nk_colorf color;
  nk_colorf color_00;
  nk_colorf color_01;
  nk_colorf color_02;
  nk_vec2 pos;
  nk_vec2 pos_00;
  nk_draw_index nVar1;
  void *pvVar2;
  nk_draw_index *pnVar3;
  nk_convert_config *config;
  long lVar4;
  void *pvVar5;
  nk_vec2 nVar6;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  nk_vec2 nVar7;
  undefined8 in_XMM1_Qa;
  nk_draw_index index;
  nk_draw_index *idx;
  nk_colorf col_bottom;
  nk_colorf col_right;
  nk_colorf col_top;
  nk_colorf col_left;
  void *vtx;
  nk_draw_list *in_stack_ffffffffffffff18;
  nk_handle in_stack_ffffffffffffff20;
  nk_draw_list *in_stack_ffffffffffffff28;
  nk_convert_config *in_stack_ffffffffffffff38;
  void *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  nk_vec2 in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  float local_10;
  float fStack_c;
  float local_8;
  float fStack_4;
  
  nk_color_fv((float *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff20._4_4_);
  nk_color_fv((float *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff20._4_4_);
  nk_color_fv((float *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff20._4_4_);
  nk_color_fv((float *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff20._4_4_);
  if (in_RDI != 0) {
    nk_draw_list_push_image(in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
    nVar1 = (nk_draw_index)*(undefined4 *)(in_RDI + 0xcc);
    pvVar2 = nk_draw_list_alloc_vertices(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20.ptr);
    pnVar3 = nk_draw_list_alloc_elements
                       (in_stack_ffffffffffffff28,(nk_size)in_stack_ffffffffffffff20);
    if ((pvVar2 != (void *)0x0) && (pnVar3 != (nk_draw_index *)0x0)) {
      *pnVar3 = nVar1;
      pnVar3[1] = nVar1 + 1;
      pnVar3[2] = nVar1 + 2;
      pnVar3[3] = nVar1;
      pnVar3[4] = nVar1 + 2;
      pnVar3[5] = nVar1 + 3;
      local_10 = (float)in_XMM0_Qa;
      fStack_c = (float)((ulong)in_XMM0_Qa >> 0x20);
      nk_vec2(local_10,fStack_c);
      nVar6.y = in_stack_ffffffffffffff64;
      nVar6.x = in_stack_ffffffffffffff60;
      color.b = (float)(int)in_stack_ffffffffffffff50;
      color.a = (float)(int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
      color.r = (float)(int)in_stack_ffffffffffffff48;
      color.g = (float)(int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
      nk_draw_vertex(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,nVar6,
                     in_stack_ffffffffffffff58,color);
      config = (nk_convert_config *)(in_RDI + 0x70);
      local_8 = (float)in_XMM1_Qa;
      nk_vec2(local_10 + local_8,fStack_c);
      nVar7.y = in_stack_ffffffffffffff64;
      nVar7.x = in_stack_ffffffffffffff60;
      color_00.b = (float)(int)in_stack_ffffffffffffff50;
      color_00.a = (float)(int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
      color_00.r = (float)(int)in_stack_ffffffffffffff48;
      color_00.g = (float)(int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
      pvVar2 = nk_draw_vertex(in_stack_ffffffffffffff40,config,nVar7,in_stack_ffffffffffffff58,
                              color_00);
      lVar4 = in_RDI + 0x70;
      fStack_4 = (float)((ulong)in_XMM1_Qa >> 0x20);
      nk_vec2(local_10 + local_8,fStack_c + fStack_4);
      pos.y = in_stack_ffffffffffffff64;
      pos.x = in_stack_ffffffffffffff60;
      color_01.b = (float)(int)in_stack_ffffffffffffff50;
      color_01.a = (float)(int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
      color_01.r = (float)(int)lVar4;
      color_01.g = (float)(int)((ulong)lVar4 >> 0x20);
      pvVar5 = nk_draw_vertex(pvVar2,config,pos,in_stack_ffffffffffffff58,color_01);
      nVar6 = (nk_vec2)(in_RDI + 0x70);
      nVar7 = nk_vec2(local_10,fStack_c + fStack_4);
      pos_00.y = nVar7.x;
      pos_00.x = in_stack_ffffffffffffff60;
      color_02._8_8_ = pvVar5;
      color_02.r = (float)(int)lVar4;
      color_02.g = (float)(int)((ulong)lVar4 >> 0x20);
      nk_draw_vertex(pvVar2,config,pos_00,nVar6,color_02);
    }
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_fill_rect_multi_color(struct nk_draw_list *list, struct nk_rect rect,
struct nk_color left, struct nk_color top, struct nk_color right,
struct nk_color bottom)
{
void *vtx;
struct nk_colorf col_left, col_top;
struct nk_colorf col_right, col_bottom;
nk_draw_index *idx;
nk_draw_index index;

nk_color_fv(&col_left.r, left);
nk_color_fv(&col_right.r, right);
nk_color_fv(&col_top.r, top);
nk_color_fv(&col_bottom.r, bottom);

NK_ASSERT(list);
if (!list) return;

nk_draw_list_push_image(list, list->config.null.texture);
index = (nk_draw_index)list->vertex_count;
vtx = nk_draw_list_alloc_vertices(list, 4);
idx = nk_draw_list_alloc_elements(list, 6);
if (!vtx || !idx) return;

idx[0] = (nk_draw_index)(index+0); idx[1] = (nk_draw_index)(index+1);
idx[2] = (nk_draw_index)(index+2); idx[3] = (nk_draw_index)(index+0);
idx[4] = (nk_draw_index)(index+2); idx[5] = (nk_draw_index)(index+3);

vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(rect.x, rect.y), list->config.null.uv, col_left);
vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(rect.x + rect.w, rect.y), list->config.null.uv, col_top);
vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(rect.x + rect.w, rect.y + rect.h), list->config.null.uv, col_right);
vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(rect.x, rect.y + rect.h), list->config.null.uv, col_bottom);
}